

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.cc
# Opt level: O2

int pkcs7_add_signed_data
              (CBB *out,uint64_t signed_data_version,_func_int_CBB_ptr_void_ptr *digest_algos_cb,
              _func_int_CBB_ptr_void_ptr *cert_crl_cb,_func_int_CBB_ptr_void_ptr *signer_infos_cb,
              void *arg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CBB seq;
  CBB signer_infos;
  CBB digest_algos_set;
  CBB outer_seq;
  CBB content_info;
  CBB wrapped_seq;
  
  iVar1 = CBB_add_asn1(out,&outer_seq,0x20000010);
  iVar3 = 0;
  iVar2 = 0;
  if (((((iVar1 != 0) &&
        (iVar1 = CBB_add_asn1_element(&outer_seq,6,kPKCS7SignedData,9), iVar2 = iVar3, iVar1 != 0))
       && (iVar1 = CBB_add_asn1(&outer_seq,&wrapped_seq,0xa0000000), iVar1 != 0)) &&
      ((iVar1 = CBB_add_asn1(&wrapped_seq,&seq,0x20000010), iVar1 != 0 &&
       (iVar1 = CBB_add_asn1_uint64(&seq,signed_data_version), iVar1 != 0)))) &&
     (iVar1 = CBB_add_asn1(&seq,&digest_algos_set,0x20000011), iVar1 != 0)) {
    if ((digest_algos_cb != (_func_int_CBB_ptr_void_ptr *)0x0) &&
       (iVar1 = (*digest_algos_cb)(&digest_algos_set,arg), iVar1 == 0)) {
      return 0;
    }
    iVar1 = CBB_flush_asn1_set_of(&digest_algos_set);
    if (((iVar1 != 0) && (iVar1 = CBB_add_asn1(&seq,&content_info,0x20000010), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1_element(&content_info,6,kPKCS7Data,9), iVar1 != 0)) {
      if ((cert_crl_cb != (_func_int_CBB_ptr_void_ptr *)0x0) &&
         (iVar1 = (*cert_crl_cb)(&seq,arg), iVar1 == 0)) {
        return 0;
      }
      iVar1 = CBB_add_asn1(&seq,&signer_infos,0x20000011);
      if (iVar1 != 0) {
        if ((signer_infos_cb != (_func_int_CBB_ptr_void_ptr *)0x0) &&
           (iVar1 = (*signer_infos_cb)(&signer_infos,arg), iVar1 == 0)) {
          return 0;
        }
        iVar1 = CBB_flush_asn1_set_of(&signer_infos);
        if (iVar1 != 0) {
          iVar2 = CBB_flush(out);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int pkcs7_add_signed_data(CBB *out, uint64_t signed_data_version,
                          int (*digest_algos_cb)(CBB *out, void *arg),
                          int (*cert_crl_cb)(CBB *out, void *arg),
                          int (*signer_infos_cb)(CBB *out, void *arg),
                          void *arg) {
  CBB outer_seq, wrapped_seq, seq, digest_algos_set, content_info, signer_infos;

  // See https://tools.ietf.org/html/rfc2315#section-7
  if (!CBB_add_asn1(out, &outer_seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&outer_seq, CBS_ASN1_OBJECT, kPKCS7SignedData,
                            sizeof(kPKCS7SignedData)) ||
      !CBB_add_asn1(&outer_seq, &wrapped_seq,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
      // See https://tools.ietf.org/html/rfc2315#section-9.1
      !CBB_add_asn1(&wrapped_seq, &seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&seq, signed_data_version) ||
      !CBB_add_asn1(&seq, &digest_algos_set, CBS_ASN1_SET) ||
      (digest_algos_cb != NULL && !digest_algos_cb(&digest_algos_set, arg)) ||
      !CBB_flush_asn1_set_of(&digest_algos_set) ||
      !CBB_add_asn1(&seq, &content_info, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                            sizeof(kPKCS7Data)) ||
      (cert_crl_cb != NULL && !cert_crl_cb(&seq, arg)) ||
      !CBB_add_asn1(&seq, &signer_infos, CBS_ASN1_SET) ||
      (signer_infos_cb != NULL && !signer_infos_cb(&signer_infos, arg)) ||
      !CBB_flush_asn1_set_of(&signer_infos)) {
    return 0;
  }

  return CBB_flush(out);
}